

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

SockData * AGSSock::recvfrom_impl<AGSSock::SockData>(Socket *sock,SockAddr *addr)

{
  size_t count;
  int *piVar1;
  SockData *pSVar2;
  socklen_t addrlen;
  char buffer [65536];
  socklen_t sStack_1001c;
  char acStack_10018 [65535];
  undefined1 local_19;
  
  local_19 = 0;
  sStack_1001c = 0x80;
  pSVar2 = (SockData *)0x0;
  count = recvfrom(sock->id,acStack_10018,0xffff,0,(sockaddr *)addr,&sStack_1001c);
  piVar1 = __errno_location();
  sock->error = *piVar1;
  if (count != 0xffffffffffffffff) {
    pSVar2 = recvfrom_return<AGSSock::SockData>(acStack_10018,count);
  }
  return pSVar2;
}

Assistant:

inline T *recvfrom_impl(Socket *sock, SockAddr *addr)
{
	char buffer[65536];
	buffer[sizeof (buffer) - 1] = 0;

	ADDRLEN addrlen = sizeof (SockAddr);
	long ret = recvfrom(sock->id, buffer, sizeof (buffer) - 1, 0,
		ADDR(addr), &addrlen);
	sock->error = GET_ERROR();
	
	if (ret == SOCKET_ERROR)
		return nullptr;
	
	return recvfrom_return<T>(buffer, ret);
}